

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.hpp
# Opt level: O0

string * __thiscall
CommandLineParseResult::getValue_abi_cxx11_
          (string *__return_storage_ptr__,CommandLineParseResult *this,Option *option)

{
  char *__s;
  bool bVar1;
  pointer pvVar2;
  allocator<char> local_31;
  _Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_28;
  const_iterator search;
  Option *option_local;
  CommandLineParseResult *this_local;
  
  search.
  super__Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               )option;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Option>,_std::equal_to<Option>,_std::allocator<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->options,option);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Option>,_std::equal_to<Option>,_std::allocator<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->options);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    __s = *(char **)((long)search.
                           super__Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                           ._M_cur + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pvVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

auto getValue(const Option& option) -> std::string {
        auto search = options.find(option);
        if (search == options.end())
            return option.defaultValue;

        return search->second;
    }